

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void convert_6u32s_C1R(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  OPJ_INT32 OVar3;
  byte *pbVar4;
  OPJ_UINT32 val2_1;
  OPJ_UINT32 val1_1;
  OPJ_UINT32 val0_1;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffffc); _val1 = _val1 + 4) {
    OVar3 = *pDst_local;
    pbVar4 = (byte *)((long)pDst_local + 2);
    bVar1 = *(byte *)((long)pDst_local + 1);
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 3);
    bVar2 = *pbVar4;
    pDst[_val1] = (uint)(byte)((byte)OVar3 >> 2);
    pDst[_val1 + 1] = ((byte)OVar3 & 3) << 4 | (uint)(bVar1 >> 4);
    pDst[_val1 + 2] = (bVar1 & 0xf) << 2 | (uint)(bVar2 >> 6);
    pDst[_val1 + 3] = bVar2 & 0x3f;
  }
  if ((length & 3) != 0) {
    OVar3 = *pDst_local;
    pDst[_val1] = (uint)(byte)((byte)OVar3 >> 2);
    if (1 < (length & 3)) {
      bVar1 = *(byte *)((long)pDst_local + 1);
      pDst[_val1 + 1] = ((byte)OVar3 & 3) << 4 | (uint)(bVar1 >> 4);
      if (2 < (length & 3)) {
        pDst[_val1 + 2] = (bVar1 & 0xf) << 2 | (uint)(*(byte *)((long)pDst_local + 2) >> 6);
      }
    }
  }
  return;
}

Assistant:

static void convert_6u32s_C1R(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		pDst[i+0] = (OPJ_INT32)(val0 >> 2);
		pDst[i+1] = (OPJ_INT32)(((val0 & 0x3U) << 4) | (val1 >> 4));
		pDst[i+2] = (OPJ_INT32)(((val1 & 0xFU) << 2) | (val2 >> 6));
		pDst[i+3] = (OPJ_INT32)(val2 & 0x3FU);
		
	}
	if (length & 3U) {
		OPJ_UINT32 val0 = *pSrc++;
		length = length & 3U;
		pDst[i+0] = (OPJ_INT32)(val0 >> 2);
		
		if (length > 1U) {
			OPJ_UINT32 val1 = *pSrc++;
			pDst[i+1] = (OPJ_INT32)(((val0 & 0x3U) << 4) | (val1 >> 4));
			if (length > 2U) {
				OPJ_UINT32 val2 = *pSrc++;
				pDst[i+2] = (OPJ_INT32)(((val1 & 0xFU) << 2) | (val2 >> 6));
			}
		}
	}
}